

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O0

void anon_unknown.dwarf_33ee6::SequenceTester<QList<QtPromise::QPromise<int>_>_>::exec(void)

{
  initializer_list<int> args;
  initializer_list<QtPromise::QPromise<int>_> args_00;
  bool bVar1;
  iterator *piVar2;
  QPromise<int> *local_168;
  int local_160 [4];
  iterator local_150;
  undefined8 local_148;
  QList<int> local_140;
  QList<int> local_128;
  QList<int> local_108;
  undefined4 local_f0;
  bool local_ea;
  bool local_e9;
  undefined1 local_e8 [8];
  QPromise<QList<int>_> p;
  int local_cc;
  QPromise<int> local_c8;
  iterator local_b8;
  QPromise<int> *local_b0;
  const_iterator local_a8;
  int local_9c;
  QPromise<int> local_98;
  int local_84 [6];
  int local_6c;
  QtPromise *local_68;
  QPromise<int> local_60;
  QtPromise local_50 [16];
  QtPromise local_40 [16];
  QPromise<int> local_30;
  undefined1 local_20 [8];
  QList<QtPromise::QPromise<int>_> promises;
  
  local_68 = (QtPromise *)&local_60;
  local_6c = 0x2a;
  QtPromise::resolve<int>(local_68,&local_6c);
  local_68 = local_50;
  local_84[1] = 0x2b;
  QtPromise::resolve<int>(local_68,local_84 + 1);
  local_68 = local_40;
  local_84[0] = 0x2c;
  QtPromise::resolve<int>(local_68,local_84);
  local_30.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&local_60;
  local_30.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x3;
  args_00._M_len = 3;
  args_00._M_array = (iterator)local_30.super_QPromiseBase<int>._vptr_QPromiseBase;
  QList<QtPromise::QPromise<int>_>::QList((QList<QtPromise::QPromise<int>_> *)local_20,args_00);
  local_168 = &local_30;
  do {
    local_168 = local_168 + -1;
    QtPromise::QPromise<int>::~QPromise(local_168);
  } while (local_168 != &local_60);
  local_9c = 0x2d;
  QtPromise::resolve<int>((QtPromise *)&local_98,&local_9c);
  QList<QtPromise::QPromise<int>_>::push_back
            ((QList<QtPromise::QPromise<int>_> *)local_20,&local_98);
  QtPromise::QPromise<int>::~QPromise(&local_98);
  local_b8 = QList<QtPromise::QPromise<int>_>::begin((QList<QtPromise::QPromise<int>_> *)local_20);
  piVar2 = QList<QtPromise::QPromise<int>_>::iterator::operator++(&local_b8);
  local_b0 = piVar2->i;
  QList<QtPromise::QPromise<int>_>::const_iterator::const_iterator(&local_a8,(iterator)local_b0);
  local_cc = 0x2e;
  QtPromise::resolve<int>((QtPromise *)&local_c8,&local_cc);
  p.super_QPromiseBase<QList<int>_>.m_d.d =
       (PromiseData<QList<int>_> *)
       QList<QtPromise::QPromise<int>_>::insert
                 ((QList<QtPromise::QPromise<int>_> *)local_20,local_a8,&local_c8);
  QtPromise::QPromise<int>::~QPromise(&local_c8);
  QList<QtPromise::QPromise<int>_>::pop_back((QList<QtPromise::QPromise<int>_> *)local_20);
  QtPromise::qPromiseAll<QList<QtPromise::QPromise<int>>&>
            ((QtPromise *)local_e8,(QList<QtPromise::QPromise<int>_> *)local_20);
  local_e9 = QtPromise::QPromiseBase<QList<int>_>::isPending((QPromiseBase<QList<int>_> *)local_e8);
  local_ea = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_e9,&local_ea,"p.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0x32);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_128.d.d = (Data *)0x0;
    local_128.d.ptr = (int *)0x0;
    local_128.d.size = 0;
    QList<int>::QList(&local_128);
    waitForValue<QList<int>>(&local_108,(QPromise<QList<int>_> *)local_e8,&local_128);
    local_160[0] = 0x2a;
    local_160[1] = 0x2e;
    local_160[2] = 0x2b;
    local_160[3] = 0x2c;
    local_150 = local_160;
    local_148 = 4;
    args._M_len = 4;
    args._M_array = local_150;
    QList<int>::QList(&local_140,args);
    bVar1 = QTest::qCompare<int>
                      (&local_108,&local_140,"waitForValue(p, QVector<int>{})",
                       "(QVector<int>{42, 46, 43, 44})",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x33);
    QList<int>::~QList(&local_140);
    QList<int>::~QList(&local_108);
    QList<int>::~QList(&local_128);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_f0 = 0;
    }
    else {
      local_f0 = 1;
    }
  }
  else {
    local_f0 = 1;
  }
  QtPromise::QPromise<QList<int>_>::~QPromise((QPromise<QList<int>_> *)local_e8);
  QList<QtPromise::QPromise<int>_>::~QList((QList<QtPromise::QPromise<int>_> *)local_20);
  return;
}

Assistant:

static void exec()
    {
        Sequence promises{QtPromise::resolve(42), QtPromise::resolve(43), QtPromise::resolve(44)};

        promises.push_back(QtPromise::resolve(45));
        promises.insert(++promises.begin(), QtPromise::resolve(46));
        promises.pop_back();

        auto p = qPromiseAll(promises);

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
        QCOMPARE(p.isPending(), true);
        QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{42, 46, 43, 44}));
    }